

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O0

optional<PSEngine::TurnHistory> * __thiscall
PSEngine::next_turn(optional<PSEngine::TurnHistory> *__return_storage_ptr__,PSEngine *this)

{
  bool bVar1;
  reference this_00;
  size_type sVar2;
  undefined1 local_f0 [8];
  TurnHistory cancelled_turn_history;
  Command *command;
  iterator __end3;
  iterator __begin3;
  vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_> *__range3;
  vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_> subturn_commands;
  undefined1 local_90 [6];
  bool keep_computing_subturn;
  bool win_requested_by_command;
  undefined1 local_60 [8];
  TurnHistory last_turn_history_save;
  Level last_turn_save;
  PSEngine *this_local;
  
  Level::Level((Level *)&last_turn_history_save.was_turn_cancelled,&this->m_current_level);
  TurnHistory::TurnHistory((TurnHistory *)local_60,&this->m_turn_history);
  memset(local_90,0,0x20);
  TurnHistory::TurnHistory((TurnHistory *)local_90);
  TurnHistory::operator=(&this->m_turn_history,(TurnHistory *)local_90);
  TurnHistory::~TurnHistory((TurnHistory *)local_90);
  subturn_commands.super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  do {
    subturn_commands.
    super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    bVar1 = next_subturn(this);
    if (bVar1) {
      this_00 = std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::
                back(&(this->m_turn_history).subturns);
      SubturnHistory::gather_all_subturn_commands
                ((vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_> *)&__range3,
                 this_00);
      __end3 = std::vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>::begin
                         ((vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_> *)
                          &__range3);
      command = (Command *)
                std::vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>::end
                          ((vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_> *)
                           &__range3);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<CompiledGame::Command_*,_std::vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>_>
                                         *)&command), bVar1) {
        cancelled_turn_history._24_8_ =
             __gnu_cxx::
             __normal_iterator<CompiledGame::Command_*,_std::vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>_>
             ::operator*(&__end3);
        if (((reference)cancelled_turn_history._24_8_)->type == Win) {
          subturn_commands.
          super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
          subturn_commands.
          super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        }
        else {
          if (((reference)cancelled_turn_history._24_8_)->type == Cancel) {
            Level::operator=(&this->m_current_level,
                             (Level *)&last_turn_history_save.was_turn_cancelled);
            TurnHistory::TurnHistory((TurnHistory *)local_f0,&this->m_turn_history);
            cancelled_turn_history.subturns.
            super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
            TurnHistory::operator=(&this->m_turn_history,(TurnHistory *)local_60);
            std::optional<PSEngine::TurnHistory>::optional<PSEngine::TurnHistory_&,_true>
                      (__return_storage_ptr__,(TurnHistory *)local_f0);
            bVar1 = true;
            TurnHistory::~TurnHistory((TurnHistory *)local_f0);
            goto LAB_001247b6;
          }
          if ((((reference)cancelled_turn_history._24_8_)->type == Again) &&
             ((subturn_commands.
               super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0)) {
            subturn_commands.
            super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
          }
        }
        __gnu_cxx::
        __normal_iterator<CompiledGame::Command_*,_std::vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>_>
        ::operator++(&__end3);
      }
      bVar1 = false;
LAB_001247b6:
      std::vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>::~vector
                ((vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_> *)&__range3)
      ;
      if (bVar1) goto LAB_00124893;
    }
  } while ((subturn_commands.
            super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0);
  sVar2 = std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::size
                    (&(this->m_turn_history).subturns);
  if (sVar2 != 0) {
    std::vector<PSEngine::Level,_std::allocator<PSEngine::Level>_>::push_back
              (&this->m_level_state_stack,(value_type *)&last_turn_history_save.was_turn_cancelled);
    print_subturns_history(this);
  }
  bVar1 = check_win_conditions(this);
  if ((bVar1) ||
     ((subturn_commands.
       super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0)) {
    this->m_is_level_won = true;
  }
  std::optional<PSEngine::TurnHistory>::optional<PSEngine::TurnHistory_&,_true>
            (__return_storage_ptr__,&this->m_turn_history);
LAB_00124893:
  TurnHistory::~TurnHistory((TurnHistory *)local_60);
  Level::~Level((Level *)&last_turn_history_save.was_turn_cancelled);
  return __return_storage_ptr__;
}

Assistant:

optional<PSEngine::TurnHistory> PSEngine::next_turn()
{
    Level last_turn_save = m_current_level;
    TurnHistory last_turn_history_save = m_turn_history;

    m_turn_history = TurnHistory();

    bool win_requested_by_command = false;
    bool keep_computing_subturn = false;
    do
    {
        keep_computing_subturn = false;

        if(next_subturn())
        {
            vector<CompiledGame::Command> subturn_commands = m_turn_history.subturns.back().gather_all_subturn_commands();

            for(const auto& command : subturn_commands)
            {
                if(command.type == CompiledGame::CommandType::Win)
                {
                    win_requested_by_command = true;
                    keep_computing_subturn = false;
                }
                else if (command.type == CompiledGame::CommandType::Cancel)
                {
                    m_current_level = last_turn_save;
                    TurnHistory cancelled_turn_history = m_turn_history;
                    cancelled_turn_history.was_turn_cancelled = true;
                    m_turn_history = last_turn_history_save;
                    return optional<PSEngine::TurnHistory>(cancelled_turn_history);
                }
                else if (command.type == CompiledGame::CommandType::Again)
                {
                    if(!win_requested_by_command)
                    {
                        keep_computing_subturn = true;
                    }
                }

            }
        }

    } while (keep_computing_subturn); //todo add an infinite loop safety

    if( m_turn_history.subturns.size() > 0)
    {
        m_level_state_stack.push_back(last_turn_save);
        print_subturns_history();
    }
    //else it means nothing happened

    if(check_win_conditions() || win_requested_by_command)
    {
        m_is_level_won = true;
    }

    return optional<PSEngine::TurnHistory>(m_turn_history);
}